

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool saveCameraCalibration(string *name,Mat *cameraMatrix,Mat *distortionCoefficients)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  ostream *poVar5;
  double *pdVar6;
  double value_1;
  int c_1;
  int r_1;
  double value;
  int c;
  int r;
  uint16_t columns;
  uint16_t rows;
  long local_228;
  ofstream outStream;
  Mat *distortionCoefficients_local;
  Mat *cameraMatrix_local;
  string *name_local;
  
  std::ofstream::ofstream(&local_228,name,0x10);
  bVar4 = std::ios::operator_cast_to_bool((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if (bVar4) {
    uVar2 = *(ushort *)(cameraMatrix + 8);
    uVar3 = *(ushort *)(cameraMatrix + 0xc);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,uVar2);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,uVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Camera matrix rows: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Camera matrix rows: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (value._4_4_ = 0; value._4_4_ < (int)(uint)uVar2; value._4_4_ = value._4_4_ + 1) {
      for (value._0_4_ = 0; value._0_4_ < (int)(uint)uVar3; value._0_4_ = value._0_4_ + 1) {
        pdVar6 = cv::Mat::at<double>(cameraMatrix,value._4_4_,value._0_4_);
        dVar1 = *pdVar6;
        std::operator<<((ostream *)&std::cout,"..");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,dVar1);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
    uVar2 = *(ushort *)(distortionCoefficients + 8);
    uVar3 = *(ushort *)(distortionCoefficients + 0xc);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,uVar2);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,uVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Distortion coefficient rows: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Distortion coefficient columns: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (value_1._4_4_ = 0; value_1._4_4_ < (int)(uint)uVar2; value_1._4_4_ = value_1._4_4_ + 1) {
      for (value_1._0_4_ = 0; value_1._0_4_ < (int)(uint)uVar3; value_1._0_4_ = value_1._0_4_ + 1) {
        pdVar6 = cv::Mat::at<double>(distortionCoefficients,value_1._4_4_,value_1._0_4_);
        dVar1 = *pdVar6;
        std::operator<<((ostream *)&std::cout,"..");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_228,dVar1);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::ofstream::close();
    name_local._7_1_ = true;
  }
  else {
    name_local._7_1_ = false;
  }
  std::ofstream::~ofstream(&local_228);
  return name_local._7_1_;
}

Assistant:

bool saveCameraCalibration(std::string name, cv::Mat cameraMatrix, cv::Mat distortionCoefficients) {
    std::ofstream outStream(name);
    if (outStream)
    {
        uint16_t rows = cameraMatrix.rows;
        uint16_t columns = cameraMatrix.cols;


        outStream << rows << std::endl;
        outStream << columns << std::endl;

        std::cout << "Camera matrix rows: " << rows << std::endl;
        std::cout << "Camera matrix rows: " << columns << std::endl;

        for (int r = 0; r < rows; r++) {
            for (int c = 0; c < columns; c++) {
                double value = cameraMatrix.at<double>(r, c);
                std::cout << "..";
                outStream << value << std::endl;
            }
        }
        std::cout << "\n";

        rows = distortionCoefficients.rows;
        columns = distortionCoefficients.cols;

        outStream << rows << std::endl;
        outStream << columns << std::endl;

        std::cout << "Distortion coefficient rows: " << rows << std::endl;
        std::cout << "Distortion coefficient columns: " << columns << std::endl;

        for (int r = 0; r < rows; r++) {
            for (int c = 0; c < columns; c++) {
                double value = distortionCoefficients.at<double>(r, c);
                std::cout << "..";
                outStream << value << std::endl;
            }
        }
        std::cout << "\n";

        outStream.close();
        return true;
    }
    return false;
}